

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void google::protobuf::compiler::java::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer)

{
  int iVar1;
  Type TVar2;
  JavaType type;
  mapped_type *pmVar3;
  char *pcVar4;
  LogMessage *other;
  int i;
  int __c;
  int i_00;
  FieldDescriptor *field;
  Descriptor *descriptor_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  EnumDescriptor *descriptor_01;
  string *__s;
  key_type kStack_c8;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string singular_type;
  key_type local_68;
  key_type local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"scope",(allocator<char> *)&kStack_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&singular_type);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  UnderscoresToCamelCase_abi_cxx11_(&singular_type,(java *)descriptor,field);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"name",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  ClassName_abi_cxx11_(&singular_type,*(java **)(descriptor + 0x38),descriptor_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"containing_type",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  SimpleItoa_abi_cxx11_(&singular_type,(protobuf *)(ulong)*(uint *)(descriptor + 0x28),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"number",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  FieldConstantName_abi_cxx11_(&singular_type,(java *)descriptor,field_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"constant_name",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  __s = &singular_type;
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  pcVar4 = FieldDescriptor::index(descriptor,(char *)__s,__c);
  SimpleItoa_abi_cxx11_(&singular_type,(protobuf *)((ulong)pcVar4 & 0xffffffff),i_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"index",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  if (*(int *)(descriptor + 0x30) == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&singular_type,"",&local_a1);
  }
  else {
    DefaultValue_abi_cxx11_(&singular_type,(java *)descriptor,field_01);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"default",(allocator<char> *)&local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&singular_type);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  TVar2 = GetType(descriptor);
  if (0x11 < TVar2 - TYPE_DOUBLE) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&singular_type,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_extension.cc"
               ,0x49);
    other = internal::LogMessage::operator<<((LogMessage *)&singular_type,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&kStack_c8,other);
    internal::LogMessage::~LogMessage((LogMessage *)&singular_type);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"type_constant",(allocator<char> *)&kStack_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&singular_type);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"packed",(allocator<char> *)&kStack_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&singular_type);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"enum_map",(allocator<char> *)&kStack_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&singular_type);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&singular_type,"prototype",(allocator<char> *)&kStack_c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&singular_type);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&singular_type);
  type = GetJavaType(descriptor);
  singular_type._M_dataplus._M_p = (pointer)&singular_type.field_2;
  singular_type._M_string_length = 0;
  singular_type.field_2._M_local_buf[0] = '\0';
  if (type == JAVATYPE_ENUM) {
    ClassName_abi_cxx11_(&kStack_c8,*(java **)(descriptor + 0x50),descriptor_01);
    std::__cxx11::string::operator=((string *)&singular_type,(string *)&kStack_c8);
    std::__cxx11::string::~string((string *)&kStack_c8);
    std::operator+(&kStack_c8,&singular_type,".internalGetValueMap()");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"enum_map",(allocator<char> *)&local_48);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_68);
  }
  else {
    if (type != JAVATYPE_MESSAGE) {
      BoxedPrimitiveTypeName(type);
      std::__cxx11::string::assign((char *)&singular_type);
      goto LAB_001bbb6b;
    }
    ClassName_abi_cxx11_(&kStack_c8,*(java **)(descriptor + 0x48),(Descriptor *)descriptor_01);
    std::__cxx11::string::operator=((string *)&singular_type,(string *)&kStack_c8);
    std::__cxx11::string::~string((string *)&kStack_c8);
    std::operator+(&kStack_c8,&singular_type,".getDefaultInstance()");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"prototype",(allocator<char> *)&local_48);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_68);
  }
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&kStack_c8);
LAB_001bbb6b:
  iVar1 = *(int *)(descriptor + 0x30);
  if (iVar1 == 3) {
    std::operator+(&local_68,"java.util.List<",&singular_type);
    std::operator+(&kStack_c8,&local_68,">");
  }
  else {
    std::__cxx11::string::string((string *)&kStack_c8,(string *)&singular_type);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_a2);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_48);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&kStack_c8);
  if (iVar1 == 3) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_c8,"singular_type",(allocator<char> *)&local_48);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&kStack_c8);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&kStack_c8);
  std::__cxx11::string::~string((string *)&singular_type);
  return;
}

Assistant:

void InitTemplateVars(const FieldDescriptor* descriptor,
                      const string& scope,
                      map<string, string>* vars_pointer) {
  map<string, string> &vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCase(descriptor);
  vars["containing_type"] = ClassName(descriptor->containing_type());
  vars["number"] = SimpleItoa(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = SimpleItoa(descriptor->index());
  vars["default"] =
      descriptor->is_repeated() ? "" : DefaultValue(descriptor);
  vars["type_constant"] = TypeName(GetType(descriptor));
  vars["packed"] = descriptor->options().packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type = ClassName(descriptor->message_type());
      vars["prototype"] = singular_type + ".getDefaultInstance()";
      break;
    case JAVATYPE_ENUM:
      singular_type = ClassName(descriptor->enum_type());
      vars["enum_map"] = singular_type + ".internalGetValueMap()";
      break;
    default:
      singular_type = BoxedPrimitiveTypeName(java_type);
      break;
  }
  vars["type"] = descriptor->is_repeated() ?
      "java.util.List<" + singular_type + ">" : singular_type;
  vars["singular_type"] = singular_type;
}